

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::CounterTest_initialize_with_zero_Test::TestBody
          (CounterTest_initialize_with_zero_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_58;
  Message local_50 [3];
  int local_34;
  double local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Counter counter;
  CounterTest_initialize_with_zero_Test *this_local;
  
  Counter::Counter((Counter *)&gtest_ar.message_);
  local_30 = Counter::Value((Counter *)&gtest_ar.message_);
  local_34 = 0;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_28,"counter.Value()","0",&local_30,&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/counter_test.cc"
               ,10,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(CounterTest, initialize_with_zero) {
  Counter counter;
  EXPECT_EQ(counter.Value(), 0);
}